

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Token __thiscall slang::parsing::Preprocessor::peek(Preprocessor *this)

{
  undefined2 uVar1;
  undefined1 uVar3;
  undefined1 uVar4;
  Info *pIVar2;
  undefined4 uVar5;
  Token TVar6;
  
  pIVar2 = (this->currentToken).info;
  if (pIVar2 == (Info *)0x0) {
    TVar6 = nextProcessed(this);
    this->currentToken = TVar6;
  }
  else {
    uVar1 = (this->currentToken).kind;
    uVar3 = (this->currentToken).field_0x2;
    uVar4 = (this->currentToken).numFlags;
    uVar5 = (this->currentToken).rawLen;
    TVar6.rawLen = uVar5;
    TVar6.numFlags.raw = uVar4;
    TVar6._2_1_ = uVar3;
    TVar6.kind = uVar1;
    TVar6.info = pIVar2;
  }
  return TVar6;
}

Assistant:

Token Preprocessor::peek() {
    if (!currentToken)
        currentToken = nextProcessed();
    return currentToken;
}